

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void notch::core::internal::conv2d<3ul,float_const*,float*>
               (float *image,size_t imageWidth,size_t imageHeight,float *kernel,float *result)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  size_t sVar4;
  
  if (imageHeight != 2) {
    pfVar1 = image + imageWidth;
    pfVar2 = image + imageWidth * 2;
    lVar3 = 0;
    do {
      if (imageWidth != 2) {
        sVar4 = 2;
        do {
          result[sVar4 - 2] =
               pfVar2[sVar4] * *kernel +
               pfVar2[sVar4 - 1] * kernel[1] +
               pfVar2[sVar4 - 2] * kernel[2] +
               pfVar1[sVar4] * kernel[3] +
               pfVar1[sVar4 - 1] * kernel[4] +
               pfVar1[sVar4 - 2] * kernel[5] +
               image[sVar4] * kernel[6] +
               image[sVar4 - 2] * kernel[8] + image[sVar4 - 1] * kernel[7];
          sVar4 = sVar4 + 1;
        } while (imageWidth != sVar4);
      }
      lVar3 = lVar3 + 1;
      result = result + (imageWidth - 2);
      pfVar1 = pfVar1 + imageWidth;
      pfVar2 = pfVar2 + imageWidth;
      image = image + imageWidth;
    } while (lVar3 != imageHeight - 2);
  }
  return;
}

Assistant:

void
conv2d(Iter image, const size_t imageWidth, const size_t imageHeight,
       Iter kernel, OutIter result) {
    size_t pad = kernelSize/2;
    Iter image_topleft = image + pad*imageWidth + pad;
    size_t resultWidth = imageWidth - kernelSize + 1;
    size_t resultHeight = imageHeight - kernelSize + 1;
#ifdef NOTCH_USE_OPENMP
#pragma omp parallel for shared(image_topleft, kernel, resultWidth, resultHeight)
#endif
    for (OMP_size_t r = 0; r < resultHeight; ++r) {
        for (size_t c = 0; c < resultWidth; ++c) {
            Iter image_rc = image_topleft + r*imageWidth + c;
            OutIter result_rc = result + r*resultWidth + c;
            *result_rc = conv2dAt<kernelSize, Iter>(image_rc, imageWidth, kernel);
        }
    }
}